

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

int mj_write_jpeg_to_file(mj_jpeg_t *m,char *filename,int options)

{
  FILE *__s;
  char *in_RSI;
  long in_RDI;
  size_t len;
  uchar *buffer;
  FILE *fp;
  int in_stack_00000494;
  size_t *in_stack_00000498;
  uchar **in_stack_000004a0;
  mj_jpeg_t *in_stack_000004a8;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    __s = fopen(in_RSI,"wb");
    if (__s == (FILE *)0x0) {
      local_4 = 7;
    }
    else {
      mj_write_jpeg_to_memory
                (in_stack_000004a8,in_stack_000004a0,in_stack_00000498,in_stack_00000494);
      fwrite((void *)0x0,1,0,__s);
      fclose(__s);
      free((void *)0x0);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mj_write_jpeg_to_file(mj_jpeg_t *m, char *filename, int options) {
    FILE *         fp;
    unsigned char *buffer = NULL;
    size_t         len = 0;

    if(m == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    fp = fopen(filename, "wb");
    if(fp == NULL) {
        return MJ_ERR_FILEIO;
    }

    mj_write_jpeg_to_memory(m, &buffer, &len, options);

    fwrite(buffer, 1, len, fp);
    fclose(fp);

    free(buffer);

    return MJ_OK;
}